

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O2

vector<Config::Size,_std::allocator<Config::Size>_> *
App::arrangeGlyphs(vector<Config::Size,_std::allocator<Config::Size>_> *__return_storage_ptr__,
                  Glyphs *glyphs,Config *config)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  pointer pSVar5;
  pointer pSVar6;
  pointer pRVar7;
  pointer pRVar8;
  mapped_type *pmVar9;
  runtime_error *this;
  pointer pRVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  pointer pRVar14;
  uint32_t *__k;
  ulong uVar15;
  uint32_t uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint32_t uVar20;
  Size lastSize;
  vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> glyphRectangles;
  vector<rbp::Rect,_std::allocator<rbp::Rect>_> arrangedRectangles;
  vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> glyphRectanglesCopy;
  MaxRectsBinPack mrbp;
  
  uVar16 = (config->padding).up;
  uVar20 = (config->padding).left;
  uVar1 = (config->spacing).hor;
  uVar2 = (config->padding).right;
  uVar3 = (config->spacing).ver;
  uVar4 = (config->padding).down;
  (__return_storage_ptr__->super__Vector_base<Config::Size,_std::allocator<Config::Size>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Config::Size,_std::allocator<Config::Size>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Config::Size,_std::allocator<Config::Size>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getGlyphRectangles(&glyphRectangles,glyphs,uVar20 + uVar1 + uVar2,uVar16 + uVar3 + uVar4,config);
  rbp::MaxRectsBinPack::MaxRectsBinPack(&mrbp);
  do {
    arrangedRectangles.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    arrangedRectangles.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    arrangedRectangles.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<rbp::RectSize,_std::allocator<rbp::RectSize>_>::vector
              (&glyphRectanglesCopy,&glyphRectangles);
    lastSize.w = 0;
    lastSize.h = 0;
    uVar18 = 0;
    for (pRVar10 = glyphRectangles.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pRVar10 !=
        glyphRectangles.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl.
        super__Vector_impl_data._M_finish; pRVar10 = pRVar10 + 1) {
      uVar18 = uVar18 + (long)pRVar10->height * (long)pRVar10->width;
    }
    uVar12 = 0;
    do {
      pSVar5 = (config->textureSizeList).
               super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar15 = (long)(config->textureSizeList).
                     super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pSVar5 >> 3;
      do {
        uVar11 = uVar12;
        pRVar10 = glyphRectangles.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (uVar15 <= uVar11) goto LAB_001580ba;
        uVar13 = pSVar5[uVar11].w - (config->spacing).hor;
        uVar19 = pSVar5[uVar11].h - (config->spacing).ver;
        uVar12 = uVar11 + 1;
      } while (((ulong)uVar19 * (ulong)uVar13 < uVar18) && (uVar12 < uVar15));
      lastSize = pSVar5[uVar11];
      std::vector<rbp::RectSize,_std::allocator<rbp::RectSize>_>::operator=
                (&glyphRectangles,&glyphRectanglesCopy);
      rbp::MaxRectsBinPack::Init(&mrbp,uVar13,uVar19);
      rbp::MaxRectsBinPack::Insert(&mrbp,&glyphRectangles,&arrangedRectangles,RectBestAreaFit);
      pRVar10 = glyphRectangles.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (glyphRectangles.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>.
             _M_impl.super__Vector_impl_data._M_start !=
             glyphRectangles.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>.
             _M_impl.super__Vector_impl_data._M_finish);
LAB_001580ba:
    pRVar8 = arrangedRectangles.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pRVar7 = arrangedRectangles.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (arrangedRectangles.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
        super__Vector_impl_data._M_start ==
        arrangedRectangles.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (glyphRectangles.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl.
          super__Vector_impl_data._M_start != pRVar10) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"can not fit glyphs into texture");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar19 = 0;
      uVar13 = 0;
      for (pRVar14 = arrangedRectangles.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>.
                     _M_impl.super__Vector_impl_data._M_start; pRVar14 != pRVar8;
          pRVar14 = pRVar14 + 1) {
        uVar16 = (config->spacing).hor + pRVar14->x;
        uVar20 = (config->spacing).ver + pRVar14->y;
        __k = &pRVar14->tag;
        pmVar9 = std::
                 map<unsigned_int,_GlyphInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
                 ::operator[](glyphs,__k);
        pmVar9->x = uVar16;
        pmVar9 = std::
                 map<unsigned_int,_GlyphInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
                 ::operator[](glyphs,__k);
        pmVar9->y = uVar20;
        pSVar5 = (__return_storage_ptr__->
                 super__Vector_base<Config::Size,_std::allocator<Config::Size>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pSVar6 = (__return_storage_ptr__->
                 super__Vector_base<Config::Size,_std::allocator<Config::Size>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pmVar9 = std::
                 map<unsigned_int,_GlyphInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
                 ::operator[](glyphs,__k);
        pmVar9->page = (uint32_t)((ulong)((long)pSVar6 - (long)pSVar5) >> 3);
        uVar17 = uVar16 + pRVar14->width;
        if (uVar19 <= uVar17) {
          uVar19 = uVar17;
        }
        uVar17 = uVar20 + pRVar14->height;
        if (uVar13 <= uVar17) {
          uVar13 = uVar17;
        }
      }
      if (config->cropTexturesWidth != false) {
        lastSize.w = uVar19;
      }
      if (config->cropTexturesHeight == true) {
        lastSize.h = uVar13;
      }
      std::vector<Config::Size,_std::allocator<Config::Size>_>::push_back
                (__return_storage_ptr__,&lastSize);
    }
    std::_Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>::~_Vector_base
              (&glyphRectanglesCopy.
                super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>);
    std::_Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>::~_Vector_base
              (&arrangedRectangles.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>);
    if (pRVar7 == pRVar8) {
      rbp::MaxRectsBinPack::~MaxRectsBinPack(&mrbp);
      std::_Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>::~_Vector_base
                (&glyphRectangles.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>)
      ;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::vector<Config::Size> App::arrangeGlyphs(Glyphs& glyphs, const Config& config)
{
    const auto additionalWidth = config.spacing.hor + config.padding.left + config.padding.right;
    const auto additionalHeight = config.spacing.ver + config.padding.up + config.padding.down;
    std::vector<Config::Size> result;

    auto glyphRectangles = getGlyphRectangles(glyphs, additionalWidth, additionalHeight, config);

    rbp::MaxRectsBinPack mrbp;

    for (;;)
    {
        std::vector<rbp::Rect> arrangedRectangles;
        auto glyphRectanglesCopy = glyphRectangles;
        Config::Size lastSize;

        uint64_t allGlyphSquare = 0;
        for (const auto& i : glyphRectangles)
            allGlyphSquare += static_cast<uint64_t>(i.width) * i.height;

        for (size_t i = 0; i < config.textureSizeList.size(); ++i)
        {
            const auto& ss = config.textureSizeList[i];

            //TODO: check workAreaW,H
            const auto workAreaW = ss.w - config.spacing.hor;
            const auto workAreaH = ss.h - config.spacing.ver;

            uint64_t textureSquare = static_cast<uint64_t>(workAreaW) * workAreaH;
            if (textureSquare < allGlyphSquare && i + 1 < config.textureSizeList.size())
                continue;

            lastSize = ss;
            glyphRectangles = glyphRectanglesCopy;

            mrbp.Init(workAreaW, workAreaH);
            mrbp.Insert(glyphRectangles, arrangedRectangles, rbp::MaxRectsBinPack::RectBestAreaFit);

            if (glyphRectangles.empty())
                break;
        }

        if (arrangedRectangles.empty())
        {
            if (!glyphRectangles.empty())
                throw std::runtime_error("can not fit glyphs into texture");
            break;
        }

        std::uint32_t maxX = 0;
        std::uint32_t maxY = 0;
        for (const auto& r: arrangedRectangles)
        {
            std::uint32_t x = r.x + config.spacing.hor;
            std::uint32_t y = r.y + config.spacing.ver;

            glyphs[r.tag].x = x;
            glyphs[r.tag].y = y;
            glyphs[r.tag].page = static_cast<std::uint32_t>(result.size());

            if (maxX < x + r.width)
                maxX = x + r.width;
            if (maxY < y + r.height)
                maxY = y + r.height;
        }
        if (config.cropTexturesWidth)
            lastSize.w = maxX;
        if (config.cropTexturesHeight)
            lastSize.h = maxY;

        result.push_back(lastSize);
    }

    return result;
}